

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msbuild_objectmodel.cpp
# Opt level: O1

ssize_t __thiscall VCXProjectWriter::write(VCXProjectWriter *this,int __fd,void *__buf,size_t __n)

{
  QArrayData *pQVar1;
  QArrayData *pQVar2;
  XmlOutput *pXVar3;
  XmlOutput *pXVar4;
  undefined4 in_register_00000034;
  long in_FS_OFFSET;
  QByteArrayView QVar5;
  QByteArrayView QVar6;
  QByteArrayView QVar7;
  QByteArrayView QVar8;
  QByteArrayView QVar9;
  QByteArrayView QVar10;
  QByteArrayView QVar11;
  QByteArrayView QVar12;
  QByteArrayView QVar13;
  QByteArrayView QVar14;
  QArrayDataPointer<QString> local_140;
  QString local_128;
  xml_output local_108;
  xml_output local_c8;
  xml_output local_90;
  QString local_58;
  long local_38;
  
  pXVar4 = (XmlOutput *)CONCAT44(in_register_00000034,__fd);
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  generateCondition(&local_58,*(VCConfiguration **)((long)__buf + 0x98));
  if (*(long *)((long)__buf + 0x18) != 0) {
    QVar5.m_data = (storage_type *)0x10;
    QVar5.m_size = (qsizetype)&local_90;
    QString::fromUtf8(QVar5);
    local_90.xo_text.d.size = (qsizetype)local_90.xo_text.d.ptr;
    pQVar2 = (QArrayData *)CONCAT44(local_90._4_4_,local_90.xo_type);
    local_90.xo_type = tTag;
    local_90.xo_text.d.ptr = (char16_t *)local_90.xo_text.d.d;
    if (pQVar2 != (QArrayData *)0x0) {
      LOCK();
      (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_90.xo_value.d.d = (Data *)0x0;
    local_90.xo_value.d.ptr = (char16_t *)0x0;
    local_90.xo_value.d.size = 0;
    local_90.xo_text.d.d = (Data *)pQVar2;
    pXVar3 = XmlOutput::operator<<(pXVar4,&local_90);
    QVar6.m_data = (storage_type *)0x9;
    QVar6.m_size = (qsizetype)&local_c8;
    QString::fromUtf8(QVar6);
    local_c8.xo_text.d.size = (qsizetype)local_c8.xo_text.d.ptr;
    pQVar1 = (QArrayData *)CONCAT44(local_c8._4_4_,local_c8.xo_type);
    local_c8.xo_type = tAttributeTag;
    local_c8.xo_text.d.ptr = (char16_t *)local_c8.xo_text.d.d;
    if (pQVar1 != (QArrayData *)0x0) {
      LOCK();
      (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_c8.xo_value.d.d = local_58.d.d;
    local_c8.xo_value.d.ptr = local_58.d.ptr;
    local_c8.xo_value.d.size = local_58.d.size;
    if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_c8.xo_text.d.d = (Data *)pQVar1;
    pXVar3 = XmlOutput::operator<<(pXVar3,&local_c8);
    QVar7.m_data = (storage_type *)0x10;
    QVar7.m_size = (qsizetype)&local_108;
    QString::fromUtf8(QVar7);
    local_128.d.d = (Data *)CONCAT44(local_108._4_4_,local_108.xo_type);
    local_128.d.ptr = (char16_t *)local_108.xo_text.d.d;
    local_128.d.size = (qsizetype)local_108.xo_text.d.ptr;
    valueTagDefX(&local_108,(QStringList *)((long)__buf + 8),&local_128,";");
    XmlOutput::operator<<(pXVar3,&local_108);
    if (&(local_108.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_108.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_108.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
           + -1;
      UNLOCK();
      if (((local_108.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
          == 0) {
        QArrayData::deallocate(&(local_108.xo_value.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_108.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_108.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_108.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
           -1;
      UNLOCK();
      if (((local_108.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
          0) {
        QArrayData::deallocate(&(local_108.xo_text.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_128.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_128.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_128.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_128.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_128.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_c8.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_c8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_c8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
           -1;
      UNLOCK();
      if (((local_c8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
          0) {
        QArrayData::deallocate(&(local_c8.xo_value.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_c8.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_c8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_c8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
           -1;
      UNLOCK();
      if (((local_c8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
          0) {
        QArrayData::deallocate(&(local_c8.xo_text.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (pQVar1 != (QArrayData *)0x0) {
      LOCK();
      (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar1,2,0x10);
      }
    }
    if (&(local_90.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_90.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_90.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
           -1;
      UNLOCK();
      if (((local_90.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
          0) {
        QArrayData::deallocate(&(local_90.xo_value.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_90.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_90.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_90.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
           -1;
      UNLOCK();
      if (((local_90.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
          0) {
        QArrayData::deallocate(&(local_90.xo_text.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (pQVar2 != (QArrayData *)0x0) {
      LOCK();
      (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar2->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar2,2,0x10);
      }
    }
  }
  if (*(long *)((long)__buf + 0x30) != 0) {
    QVar8.m_data = (storage_type *)0x7;
    QVar8.m_size = (qsizetype)&local_90;
    QString::fromUtf8(QVar8);
    local_90.xo_text.d.size = (qsizetype)local_90.xo_text.d.ptr;
    pQVar2 = (QArrayData *)CONCAT44(local_90._4_4_,local_90.xo_type);
    local_90.xo_type = tTag;
    local_90.xo_text.d.ptr = (char16_t *)local_90.xo_text.d.d;
    if (pQVar2 != (QArrayData *)0x0) {
      LOCK();
      (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_90.xo_value.d.d = (Data *)0x0;
    local_90.xo_value.d.ptr = (char16_t *)0x0;
    local_90.xo_value.d.size = 0;
    local_90.xo_text.d.d = (Data *)pQVar2;
    pXVar3 = XmlOutput::operator<<(pXVar4,&local_90);
    QVar9.m_data = (storage_type *)0x9;
    QVar9.m_size = (qsizetype)&local_c8;
    QString::fromUtf8(QVar9);
    local_c8.xo_text.d.size = (qsizetype)local_c8.xo_text.d.ptr;
    pQVar1 = (QArrayData *)CONCAT44(local_c8._4_4_,local_c8.xo_type);
    local_c8.xo_type = tAttributeTag;
    local_c8.xo_text.d.ptr = (char16_t *)local_c8.xo_text.d.d;
    if (pQVar1 != (QArrayData *)0x0) {
      LOCK();
      (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_c8.xo_value.d.d = local_58.d.d;
    local_c8.xo_value.d.ptr = local_58.d.ptr;
    local_c8.xo_value.d.size = local_58.d.size;
    if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_c8.xo_text.d.d = (Data *)pQVar1;
    pXVar3 = XmlOutput::operator<<(pXVar3,&local_c8);
    local_140.d = *(Data **)((long)__buf + 0x20);
    local_140.ptr = *(QString **)((long)__buf + 0x28);
    local_140.size = *(qsizetype *)((long)__buf + 0x30);
    if (local_140.d != (Data *)0x0) {
      LOCK();
      ((local_140.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_140.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    commandLinesForOutput(&local_128,(QStringList *)&local_140);
    local_108.xo_type = tValueTag;
    local_108.xo_text.d.d = local_128.d.d;
    local_108.xo_text.d.ptr = local_128.d.ptr;
    local_108.xo_text.d.size = local_128.d.size;
    if (&(local_128.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_128.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_128.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_108.xo_value.d.d = (Data *)0x0;
    local_108.xo_value.d.ptr = (char16_t *)0x0;
    local_108.xo_value.d.size = 0;
    XmlOutput::operator<<(pXVar3,&local_108);
    if (&(local_108.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_108.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_108.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
           + -1;
      UNLOCK();
      if (((local_108.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
          == 0) {
        QArrayData::deallocate(&(local_108.xo_value.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_108.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_108.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_108.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
           -1;
      UNLOCK();
      if (((local_108.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
          0) {
        QArrayData::deallocate(&(local_108.xo_text.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_128.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_128.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_128.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_128.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_128.d.d)->super_QArrayData,2,0x10);
      }
    }
    QArrayDataPointer<QString>::~QArrayDataPointer(&local_140);
    if (&(local_c8.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_c8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_c8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
           -1;
      UNLOCK();
      if (((local_c8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
          0) {
        QArrayData::deallocate(&(local_c8.xo_value.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_c8.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_c8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_c8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
           -1;
      UNLOCK();
      if (((local_c8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
          0) {
        QArrayData::deallocate(&(local_c8.xo_text.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (pQVar1 != (QArrayData *)0x0) {
      LOCK();
      (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar1,2,0x10);
      }
    }
    if (&(local_90.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_90.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_90.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
           -1;
      UNLOCK();
      if (((local_90.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
          0) {
        QArrayData::deallocate(&(local_90.xo_value.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_90.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_90.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_90.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
           -1;
      UNLOCK();
      if (((local_90.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
          0) {
        QArrayData::deallocate(&(local_90.xo_text.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (pQVar2 != (QArrayData *)0x0) {
      LOCK();
      (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar2->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar2,2,0x10);
      }
    }
  }
  if (*(long *)((long)__buf + 0x48) != 0) {
    QVar10.m_data = (storage_type *)0x7;
    QVar10.m_size = (qsizetype)&local_90;
    QString::fromUtf8(QVar10);
    local_90.xo_text.d.size = (qsizetype)local_90.xo_text.d.ptr;
    pQVar2 = (QArrayData *)CONCAT44(local_90._4_4_,local_90.xo_type);
    local_90.xo_type = tTag;
    local_90.xo_text.d.ptr = (char16_t *)local_90.xo_text.d.d;
    if (pQVar2 != (QArrayData *)0x0) {
      LOCK();
      (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_90.xo_value.d.d = (Data *)0x0;
    local_90.xo_value.d.ptr = (char16_t *)0x0;
    local_90.xo_value.d.size = 0;
    local_90.xo_text.d.d = (Data *)pQVar2;
    pXVar3 = XmlOutput::operator<<(pXVar4,&local_90);
    QVar11.m_data = (storage_type *)0x9;
    QVar11.m_size = (qsizetype)&local_c8;
    QString::fromUtf8(QVar11);
    local_c8.xo_text.d.size = (qsizetype)local_c8.xo_text.d.ptr;
    pQVar1 = (QArrayData *)CONCAT44(local_c8._4_4_,local_c8.xo_type);
    local_c8.xo_type = tAttributeTag;
    local_c8.xo_text.d.ptr = (char16_t *)local_c8.xo_text.d.d;
    if (pQVar1 != (QArrayData *)0x0) {
      LOCK();
      (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_c8.xo_value.d.d = local_58.d.d;
    local_c8.xo_value.d.ptr = local_58.d.ptr;
    local_c8.xo_value.d.size = local_58.d.size;
    if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_c8.xo_text.d.d = (Data *)pQVar1;
    pXVar3 = XmlOutput::operator<<(pXVar3,&local_c8);
    local_108.xo_type = tValueTag;
    local_108.xo_text.d.d = *(Data **)((long)__buf + 0x38);
    local_108.xo_text.d.ptr = *(char16_t **)((long)__buf + 0x40);
    local_108.xo_text.d.size = *(undefined8 *)((long)__buf + 0x48);
    if (&(local_108.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_108.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_108.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
           1;
      UNLOCK();
    }
    local_108.xo_value.d.d = (Data *)0x0;
    local_108.xo_value.d.ptr = (char16_t *)0x0;
    local_108.xo_value.d.size = 0;
    XmlOutput::operator<<(pXVar3,&local_108);
    if (&(local_108.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_108.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_108.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
           + -1;
      UNLOCK();
      if (((local_108.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
          == 0) {
        QArrayData::deallocate(&(local_108.xo_value.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_108.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_108.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_108.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
           -1;
      UNLOCK();
      if (((local_108.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
          0) {
        QArrayData::deallocate(&(local_108.xo_text.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_c8.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_c8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_c8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
           -1;
      UNLOCK();
      if (((local_c8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
          0) {
        QArrayData::deallocate(&(local_c8.xo_value.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_c8.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_c8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_c8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
           -1;
      UNLOCK();
      if (((local_c8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
          0) {
        QArrayData::deallocate(&(local_c8.xo_text.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (pQVar1 != (QArrayData *)0x0) {
      LOCK();
      (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar1,2,0x10);
      }
    }
    if (&(local_90.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_90.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_90.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
           -1;
      UNLOCK();
      if (((local_90.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
          0) {
        QArrayData::deallocate(&(local_90.xo_value.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_90.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_90.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_90.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
           -1;
      UNLOCK();
      if (((local_90.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
          0) {
        QArrayData::deallocate(&(local_90.xo_text.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (pQVar2 != (QArrayData *)0x0) {
      LOCK();
      (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar2->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar2,2,0x10);
      }
    }
  }
  if (*(long *)((long)__buf + 0x60) != 0) {
    QVar12.m_data = (storage_type *)0x7;
    QVar12.m_size = (qsizetype)&local_90;
    QString::fromUtf8(QVar12);
    local_90.xo_text.d.size = (qsizetype)local_90.xo_text.d.ptr;
    pQVar2 = (QArrayData *)CONCAT44(local_90._4_4_,local_90.xo_type);
    local_90.xo_type = tTag;
    local_90.xo_text.d.ptr = (char16_t *)local_90.xo_text.d.d;
    if (pQVar2 != (QArrayData *)0x0) {
      LOCK();
      (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_90.xo_value.d.d = (Data *)0x0;
    local_90.xo_value.d.ptr = (char16_t *)0x0;
    local_90.xo_value.d.size = 0;
    local_90.xo_text.d.d = (Data *)pQVar2;
    pXVar4 = XmlOutput::operator<<(pXVar4,&local_90);
    QVar13.m_data = (storage_type *)0x9;
    QVar13.m_size = (qsizetype)&local_c8;
    QString::fromUtf8(QVar13);
    local_c8.xo_text.d.size = (qsizetype)local_c8.xo_text.d.ptr;
    pQVar1 = (QArrayData *)CONCAT44(local_c8._4_4_,local_c8.xo_type);
    local_c8.xo_type = tAttributeTag;
    local_c8.xo_text.d.ptr = (char16_t *)local_c8.xo_text.d.d;
    if (pQVar1 != (QArrayData *)0x0) {
      LOCK();
      (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_c8.xo_value.d.d = local_58.d.d;
    local_c8.xo_value.d.ptr = local_58.d.ptr;
    local_c8.xo_value.d.size = local_58.d.size;
    if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_c8.xo_text.d.d = (Data *)pQVar1;
    pXVar4 = XmlOutput::operator<<(pXVar4,&local_c8);
    QVar14.m_data = (storage_type *)0x7;
    QVar14.m_size = (qsizetype)&local_108;
    QString::fromUtf8(QVar14);
    local_128.d.d = (Data *)CONCAT44(local_108._4_4_,local_108.xo_type);
    local_128.d.ptr = (char16_t *)local_108.xo_text.d.d;
    local_128.d.size = (qsizetype)local_108.xo_text.d.ptr;
    valueTagDefX(&local_108,(QStringList *)((long)__buf + 0x50),&local_128,";");
    XmlOutput::operator<<(pXVar4,&local_108);
    if (&(local_108.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_108.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_108.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
           + -1;
      UNLOCK();
      if (((local_108.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
          == 0) {
        QArrayData::deallocate(&(local_108.xo_value.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_108.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_108.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_108.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
           -1;
      UNLOCK();
      if (((local_108.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
          0) {
        QArrayData::deallocate(&(local_108.xo_text.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_128.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_128.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_128.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_128.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_128.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_c8.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_c8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_c8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
           -1;
      UNLOCK();
      if (((local_c8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
          0) {
        QArrayData::deallocate(&(local_c8.xo_value.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_c8.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_c8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_c8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
           -1;
      UNLOCK();
      if (((local_c8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
          0) {
        QArrayData::deallocate(&(local_c8.xo_text.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (pQVar1 != (QArrayData *)0x0) {
      LOCK();
      (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar1,2,0x10);
      }
    }
    if (&(local_90.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_90.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_90.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
           -1;
      UNLOCK();
      if (((local_90.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
          0) {
        QArrayData::deallocate(&(local_90.xo_value.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_90.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_90.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_90.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
           -1;
      UNLOCK();
      if (((local_90.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
          0) {
        QArrayData::deallocate(&(local_90.xo_text.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (pQVar2 != (QArrayData *)0x0) {
      LOCK();
      (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar2->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar2,2,0x10);
      }
    }
  }
  if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return *(long *)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

void VCXProjectWriter::write(XmlOutput &xml, const VCCustomBuildTool &tool)
{
    const QString condition = generateCondition(*tool.config);

    if ( !tool.AdditionalDependencies.isEmpty() )
    {
        xml << tag("AdditionalInputs")
            << attrTag("Condition", condition)
            << valueTagDefX(tool.AdditionalDependencies, "AdditionalInputs", ";");
    }

    if( !tool.CommandLine.isEmpty() )
    {
        xml << tag("Command")
            << attrTag("Condition", condition)
            << valueTag(commandLinesForOutput(tool.CommandLine));
    }

    if ( !tool.Description.isEmpty() )
    {
        xml << tag("Message")
            << attrTag("Condition", condition)
            << valueTag(tool.Description);
    }

    if ( !tool.Outputs.isEmpty() )
    {
        xml << tag("Outputs")
            << attrTag("Condition", condition)
            << valueTagDefX(tool.Outputs, "Outputs", ";");
    }
}